

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  ImGuiWindow *pIVar1;
  ImGuiTable *table;
  ImGuiContext *pIVar2;
  ImGuiListClipperData *this_00;
  int i;
  ImGuiListClipperData local_58;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  this->StartPosY = (pIVar1->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  i = pIVar2->ClipperTempDataStacked;
  pIVar2->ClipperTempDataStacked = i + 1;
  if ((pIVar2->ClipperTempData).Size <= i) {
    local_58.ItemsFrozen = 0;
    local_58._20_4_ = 0;
    local_58.Ranges.Size = 0;
    local_58.Ranges.Capacity = 0;
    local_58.ListClipper = (ImGuiListClipper *)0x0;
    local_58.LossynessOffset = 0.0;
    local_58.StepNo = 0;
    local_58.Ranges.Data = (ImGuiListClipperRange *)0x0;
    ImVector<ImGuiListClipperData>::resize(&pIVar2->ClipperTempData,i + 1,&local_58);
    ImVector<ImGuiListClipperRange>::~ImVector(&local_58.Ranges);
    i = pIVar2->ClipperTempDataStacked + -1;
  }
  this_00 = ImVector<ImGuiListClipperData>::operator[](&pIVar2->ClipperTempData,i);
  ImGuiListClipperData::Reset(this_00,this);
  this_00->LossynessOffset = (pIVar1->DC).CursorStartPosLossyness.y;
  this->TempData = this_00;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}